

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImRect ImGui::TableGetCellBgRect(ImGuiTable *table,int column_n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiTableColumn *pIVar4;
  uint uVar5;
  float fVar6;
  ImRect IVar7;
  
  pIVar4 = (table->Columns).Data;
  fVar1 = pIVar4[column_n].MinX;
  fVar6 = pIVar4[column_n].MaxX;
  fVar2 = (table->WorkRect).Min.x;
  uVar5 = -(uint)(fVar2 <= fVar1);
  fVar3 = (table->WorkRect).Max.x;
  if (fVar3 <= fVar6) {
    fVar6 = fVar3;
  }
  IVar7.Min.y = table->RowPosY1;
  IVar7.Min.x = (float)(~uVar5 & (uint)fVar2 | (uint)fVar1 & uVar5);
  IVar7.Max.y = table->RowPosY2;
  IVar7.Max.x = fVar6;
  return IVar7;
}

Assistant:

inline const T&     operator[](int i) const     { const T* p = Data + i; IM_ASSERT(p >= Data && p < DataEnd); return *p; }